

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O3

int X509_policy_check(X509_POLICY_TREE **ptree,int *pexplicit_policy,stack_st_X509 *certs,
                     stack_st_ASN1_OBJECT *policy_oids,uint flags)

{
  byte bVar1;
  undefined1 *puVar2;
  int iVar3;
  uint uVar4;
  OPENSSL_STACK *pOVar5;
  OPENSSL_STACK *pOVar6;
  X509 *x;
  X509_POLICY_LEVEL *pXVar7;
  size_t sVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  size_t sVar11;
  OPENSSL_STACK *pOVar12;
  X509_POLICY_NODE *pXVar13;
  POLICY_MAPPING *a;
  X509_POLICY_NODE *pXVar14;
  POLICY_CONSTRAINTS *a_00;
  ASN1_INTEGER *skip_certs;
  ASN1_OBJECT *pAVar15;
  size_t sVar16;
  void *pvVar17;
  ASN1_OBJECT *policy;
  X509_POLICY_LEVEL *pXVar18;
  bool bVar19;
  size_t explicit_policy;
  size_t policy_mapping;
  size_t inhibit_any_policy;
  OPENSSL_STACK *local_a8;
  int local_9c;
  undefined8 local_98;
  OPENSSL_STACK *local_90;
  OPENSSL_STACK *local_88;
  OPENSSL_STACK *local_80;
  OPENSSL_STACK *local_78;
  undefined1 *local_70;
  OPENSSL_STACK *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  OPENSSL_STACK *local_50;
  stack_st_ASN1_OBJECT *local_48;
  OPENSSL_STACK *local_40;
  OPENSSL_STACK *local_38;
  
  *(undefined8 *)&policy_oids->stack = 0;
  pOVar5 = (OPENSSL_STACK *)OPENSSL_sk_num((OPENSSL_STACK *)ptree);
  if (pOVar5 < (OPENSSL_STACK *)0x2) {
    return 0;
  }
  local_60 = (undefined1 *)((long)&pOVar5->num + 1);
  uVar4 = (uint)certs;
  local_70 = (undefined1 *)0x0;
  if ((uVar4 >> 8 & 1) == 0) {
    local_70 = local_60;
  }
  local_58 = (undefined1 *)0x0;
  if ((uVar4 >> 9 & 1) == 0) {
    local_58 = local_60;
  }
  if ((uVar4 >> 10 & 1) != 0) {
    local_60 = (undefined1 *)0x0;
  }
  pOVar6 = OPENSSL_sk_new_null();
  local_98 = 0x11;
  if (pOVar6 == (OPENSSL_STACK *)0x0) {
    local_a8 = (OPENSSL_STACK *)0x0;
    pXVar18 = (X509_POLICY_LEVEL *)0x0;
  }
  else {
    local_40 = (OPENSSL_STACK *)((long)&pOVar5[-1].comp + 6);
    pXVar18 = (X509_POLICY_LEVEL *)0x0;
    pOVar12 = local_40;
    local_88 = pOVar6;
    local_68 = (OPENSSL_STACK *)ptree;
    local_50 = (OPENSSL_STACK *)pexplicit_policy;
    local_48 = policy_oids;
    local_38 = pOVar5;
    do {
      x = (X509 *)OPENSSL_sk_value(local_68,(size_t)pOVar12);
      iVar3 = x509v3_cache_extensions((X509 *)x);
      if (iVar3 == 0) goto LAB_00216afb;
      local_78 = (OPENSSL_STACK *)CONCAT44(local_78._4_4_,(x->ex_data).dummy);
      pXVar7 = pXVar18;
      if (pXVar18 == (X509_POLICY_LEVEL *)0x0) {
        if (pOVar12 != local_40) {
          __assert_fail("i == num_certs - 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                        ,0x2be,
                        "int X509_policy_check(const struct stack_st_X509 *, const struct stack_st_ASN1_OBJECT *, unsigned long, X509 **)"
                       );
        }
        pXVar7 = x509_policy_level_new();
        if (pXVar7 == (X509_POLICY_LEVEL *)0x0) {
          pXVar18 = (X509_POLICY_LEVEL *)0x0;
          goto LAB_00216afb;
        }
        pXVar7->has_any_policy = 1;
      }
      bVar19 = local_58 != (undefined1 *)0x0;
      local_80 = pOVar12;
      pOVar5 = (OPENSSL_STACK *)X509_get_ext_d2i(x,0x59,&local_9c,(int *)0x0);
      if (pOVar5 == (OPENSSL_STACK *)0x0) {
        if (local_9c == -1) {
          pXVar7->has_any_policy = 0;
          sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar7->nodes);
          if (sVar8 != 0) {
            sVar8 = 0;
            do {
              pXVar13 = (X509_POLICY_NODE *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar7->nodes,sVar8);
              x509_policy_node_free(pXVar13);
              sVar8 = sVar8 + 1;
              sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar7->nodes);
            } while (sVar8 < sVar11);
          }
          OPENSSL_sk_zero((OPENSSL_STACK *)pXVar7->nodes);
          goto LAB_00216532;
        }
LAB_00216ae9:
        *(X509 **)&local_48->stack = x;
        local_98 = 0x2a;
        pXVar18 = pXVar7;
        goto LAB_00216afb;
      }
      sVar8 = OPENSSL_sk_num(pOVar5);
      if (sVar8 == 0) {
        pOVar12 = (OPENSSL_STACK *)0x0;
        ERR_put_error(0xb,0,0x90,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                      ,0xfa);
LAB_00216acb:
        OPENSSL_sk_pop_free_ex(pOVar12,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
        CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar5);
        goto LAB_00216ae9;
      }
      OPENSSL_sk_set_cmp_func(pOVar5,policyinfo_cmp);
      OPENSSL_sk_sort(pOVar5,sk_POLICYINFO_call_cmp_func);
      sVar8 = OPENSSL_sk_num(pOVar5);
      if (sVar8 == 0) {
        iVar3 = pXVar7->has_any_policy;
LAB_0021641b:
        OPENSSL_sk_delete_if
                  ((OPENSSL_STACK *)pXVar7->nodes,sk_X509_POLICY_NODE_call_delete_if_func,
                   delete_if_not_in_policies,pOVar5);
        pXVar7->has_any_policy = 0;
      }
      else {
        uVar4 = (uint)local_78 & 0x20;
        sVar8 = 0;
        bVar1 = 0;
        do {
          puVar9 = (undefined8 *)OPENSSL_sk_value(pOVar5,sVar8);
          iVar3 = OBJ_obj2nid((ASN1_OBJECT *)*puVar9);
          if (iVar3 == 0x2ea) {
            bVar1 = 1;
          }
          if (sVar8 != 0) {
            puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar5,sVar8 - 1);
            iVar3 = OBJ_cmp((ASN1_OBJECT *)*puVar10,(ASN1_OBJECT *)*puVar9);
            if (iVar3 == 0) {
              pOVar12 = (OPENSSL_STACK *)0x0;
              ERR_put_error(0xb,0,0x90,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                            ,0x109);
              pOVar6 = local_88;
              goto LAB_00216acb;
            }
          }
          sVar8 = sVar8 + 1;
          sVar11 = OPENSSL_sk_num(pOVar5);
        } while (sVar8 < sVar11);
        iVar3 = pXVar7->has_any_policy;
        pOVar6 = local_88;
        if (((bVar19 | pOVar12 != (OPENSSL_STACK *)0x0 & (byte)(uVar4 >> 5)) & bVar1) == 0)
        goto LAB_0021641b;
      }
      if (iVar3 == 0) {
        OPENSSL_sk_pop_free_ex
                  ((OPENSSL_STACK *)0x0,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
        CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar5);
      }
      else {
        pOVar12 = OPENSSL_sk_new_null();
        if (pOVar12 == (OPENSSL_STACK *)0x0) {
          pOVar12 = (OPENSSL_STACK *)0x0;
          goto LAB_00216acb;
        }
        sVar8 = OPENSSL_sk_num(pOVar5);
        if (sVar8 != 0) {
          sVar8 = 0;
          do {
            puVar9 = (undefined8 *)OPENSSL_sk_value(pOVar5,sVar8);
            iVar3 = OBJ_obj2nid((ASN1_OBJECT *)*puVar9);
            if ((iVar3 != 0x2ea) &&
               (pXVar13 = x509_policy_level_find(pXVar7,(ASN1_OBJECT *)*puVar9),
               pXVar13 == (X509_POLICY_NODE *)0x0)) {
              pXVar13 = x509_policy_node_new((ASN1_OBJECT *)*puVar9);
              pOVar6 = local_88;
              if (pXVar13 == (X509_POLICY_NODE *)0x0) goto LAB_00216acb;
              sVar11 = OPENSSL_sk_push(pOVar12,pXVar13);
              if (sVar11 == 0) {
                x509_policy_node_free(pXVar13);
                pOVar6 = local_88;
                goto LAB_00216acb;
              }
            }
            sVar8 = sVar8 + 1;
            sVar11 = OPENSSL_sk_num(pOVar5);
          } while (sVar8 < sVar11);
        }
        iVar3 = x509_policy_level_add_nodes(pXVar7,(stack_st_X509_POLICY_NODE *)pOVar12);
        OPENSSL_sk_pop_free_ex(pOVar12,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
        CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar5);
        pOVar6 = local_88;
        if (iVar3 == 0) goto LAB_00216ae9;
      }
LAB_00216532:
      pXVar18 = pXVar7;
      if (((local_70 == (undefined1 *)0x0) && (pXVar7->has_any_policy == 0)) &&
         (sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar7->nodes), sVar8 == 0)) {
        local_98 = 0x2b;
        goto LAB_00216afb;
      }
      sVar8 = OPENSSL_sk_push(pOVar6,pXVar7);
      puVar2 = local_60;
      if (sVar8 == 0) goto LAB_00216afb;
      bVar19 = local_80 == (OPENSSL_STACK *)0x0;
      local_80 = (OPENSSL_STACK *)((long)&local_80[-1].comp + 7);
      if (bVar19) {
        pXVar18 = (X509_POLICY_LEVEL *)0x0;
LAB_00216987:
        if (local_70 != (undefined1 *)0x0) {
          local_70 = local_70 + -1;
        }
        if (local_60 != (undefined1 *)0x0) {
          local_60 = local_60 + -1;
        }
        if (local_58 != (undefined1 *)0x0) {
          local_58 = local_58 + -1;
        }
      }
      else {
        pOVar5 = (OPENSSL_STACK *)X509_get_ext_d2i(x,0x2eb,&local_9c,(int *)0x0);
        if (pOVar5 == (OPENSSL_STACK *)0x0) {
          pXVar18 = (X509_POLICY_LEVEL *)0x0;
          pOVar6 = (OPENSSL_STACK *)0x0;
          pOVar12 = (OPENSSL_STACK *)0x0;
          if (local_9c == -1) goto LAB_002165b1;
LAB_0021692d:
          x509_policy_level_free(pXVar18);
          pXVar18 = (X509_POLICY_LEVEL *)0x0;
        }
        else {
LAB_002165b1:
          if (pOVar5 != (OPENSSL_STACK *)0x0) {
            sVar8 = OPENSSL_sk_num(pOVar5);
            pOVar12 = pOVar5;
            if (sVar8 == 0) {
              ERR_put_error(0xb,0,0x90,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                            ,0x17b);
LAB_00216735:
              pXVar18 = (X509_POLICY_LEVEL *)0x0;
              pOVar6 = (OPENSSL_STACK *)0x0;
            }
            else {
              sVar8 = OPENSSL_sk_num(pOVar5);
              if (sVar8 != 0) {
                sVar8 = 0;
                do {
                  puVar9 = (undefined8 *)OPENSSL_sk_value(pOVar5,sVar8);
                  iVar3 = OBJ_obj2nid((ASN1_OBJECT *)*puVar9);
                  if ((iVar3 == 0x2ea) ||
                     (iVar3 = OBJ_obj2nid((ASN1_OBJECT *)puVar9[1]), iVar3 == 0x2ea))
                  goto LAB_00216735;
                  sVar8 = sVar8 + 1;
                  sVar11 = OPENSSL_sk_num(pOVar5);
                } while (sVar8 < sVar11);
              }
              OPENSSL_sk_set_cmp_func(pOVar5,compare_issuer_policy);
              OPENSSL_sk_sort(pOVar5,sk_POLICY_MAPPING_call_cmp_func);
              if (puVar2 == (undefined1 *)0x0) {
                OPENSSL_sk_delete_if
                          ((OPENSSL_STACK *)pXVar7->nodes,sk_X509_POLICY_NODE_call_delete_if_func,
                           delete_if_mapped,pOVar5);
                OPENSSL_sk_pop_free_ex(pOVar5,sk_POLICY_MAPPING_call_free_func,POLICY_MAPPING_free);
                goto LAB_00216771;
              }
              pOVar6 = OPENSSL_sk_new_null();
              if (pOVar6 == (OPENSSL_STACK *)0x0) goto LAB_00216735;
              sVar8 = OPENSSL_sk_num(pOVar5);
              if (sVar8 != 0) {
                sVar8 = 0;
                pAVar15 = (ASN1_OBJECT *)0x0;
                local_90 = pOVar6;
                do {
                  puVar9 = (undefined8 *)OPENSSL_sk_value(pOVar5,sVar8);
                  if ((pAVar15 == (ASN1_OBJECT *)0x0) ||
                     (iVar3 = OBJ_cmp((ASN1_OBJECT *)*puVar9,pAVar15), iVar3 != 0)) {
                    pAVar15 = (ASN1_OBJECT *)*puVar9;
                    pXVar13 = x509_policy_level_find(pXVar7,(ASN1_OBJECT *)pAVar15);
                    if (pXVar13 == (X509_POLICY_NODE *)0x0) {
                      pOVar6 = local_90;
                      if (pXVar7->has_any_policy != 0) {
                        pXVar13 = x509_policy_node_new((ASN1_OBJECT *)*puVar9);
                        if (pXVar13 != (X509_POLICY_NODE *)0x0) {
                          sVar11 = OPENSSL_sk_push(local_90,pXVar13);
                          if (sVar11 != 0) goto LAB_002166df;
                          x509_policy_node_free(pXVar13);
                        }
                        pXVar18 = (X509_POLICY_LEVEL *)0x0;
                        pOVar6 = local_90;
                        goto LAB_0021692d;
                      }
                    }
                    else {
LAB_002166df:
                      pXVar13->mapped = 1;
                      pOVar6 = local_90;
                    }
                  }
                  sVar8 = sVar8 + 1;
                  sVar11 = OPENSSL_sk_num(pOVar5);
                } while (sVar8 < sVar11);
              }
              iVar3 = x509_policy_level_add_nodes(pXVar7,(stack_st_X509_POLICY_NODE *)pOVar6);
              if (iVar3 != 0) goto LAB_00216792;
LAB_00216916:
              pXVar18 = (X509_POLICY_LEVEL *)0x0;
              pOVar12 = pOVar5;
            }
            goto LAB_0021692d;
          }
LAB_00216771:
          pOVar5 = OPENSSL_sk_new_null();
          pOVar6 = (OPENSSL_STACK *)0x0;
          pXVar18 = (X509_POLICY_LEVEL *)0x0;
          pOVar12 = (OPENSSL_STACK *)0x0;
          if (pOVar5 == (OPENSSL_STACK *)0x0) goto LAB_0021692d;
LAB_00216792:
          pOVar12 = pOVar5;
          sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar7->nodes);
          pOVar5 = pOVar12;
          if (sVar8 != 0) {
            sVar8 = 0;
            do {
              puVar9 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar7->nodes,sVar8);
              if (*(int *)(puVar9 + 2) == 0) {
                a = POLICY_MAPPING_new();
                if (a == (POLICY_MAPPING *)0x0) goto LAB_00216916;
                pAVar15 = OBJ_dup((ASN1_OBJECT *)*puVar9);
                a->issuerDomainPolicy = pAVar15;
                pAVar15 = OBJ_dup((ASN1_OBJECT *)*puVar9);
                a->subjectDomainPolicy = pAVar15;
                if (((a->issuerDomainPolicy == (ASN1_OBJECT *)0x0) ||
                    (pAVar15 == (ASN1_OBJECT *)0x0)) ||
                   (sVar11 = OPENSSL_sk_push(pOVar12,a), sVar11 == 0)) {
                  POLICY_MAPPING_free(a);
                  goto LAB_00216916;
                }
              }
              sVar8 = sVar8 + 1;
              sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar7->nodes);
            } while (sVar8 < sVar11);
          }
          OPENSSL_sk_set_cmp_func(pOVar12,compare_subject_policy);
          OPENSSL_sk_sort(pOVar12,sk_POLICY_MAPPING_call_cmp_func);
          pXVar18 = x509_policy_level_new();
          if (pXVar18 == (X509_POLICY_LEVEL *)0x0) goto LAB_00216916;
          pXVar18->has_any_policy = pXVar7->has_any_policy;
          local_90 = pOVar6;
          sVar8 = OPENSSL_sk_num(pOVar12);
          if (sVar8 != 0) {
            sVar8 = 0;
            pXVar13 = (X509_POLICY_NODE *)0x0;
            do {
              puVar9 = (undefined8 *)OPENSSL_sk_value(pOVar12,sVar8);
              if ((pXVar7->has_any_policy != 0) ||
                 (pXVar14 = x509_policy_level_find(pXVar7,(ASN1_OBJECT *)*puVar9),
                 pXVar14 != (X509_POLICY_NODE *)0x0)) {
                if ((pXVar13 == (X509_POLICY_NODE *)0x0) ||
                   (iVar3 = OBJ_cmp((ASN1_OBJECT *)pXVar13->policy,(ASN1_OBJECT *)puVar9[1]),
                   iVar3 != 0)) {
                  pXVar13 = x509_policy_node_new((ASN1_OBJECT *)puVar9[1]);
                  pOVar6 = local_90;
                  if (pXVar13 == (X509_POLICY_NODE *)0x0) goto LAB_0021692d;
                  sVar11 = OPENSSL_sk_push((OPENSSL_STACK *)pXVar18->nodes,pXVar13);
                  if (sVar11 == 0) {
                    x509_policy_node_free(pXVar13);
                    pOVar6 = local_90;
                    goto LAB_0021692d;
                  }
                }
                sVar11 = OPENSSL_sk_push((OPENSSL_STACK *)pXVar13->parent_policies,(void *)*puVar9);
                pOVar6 = local_90;
                if (sVar11 == 0) goto LAB_0021692d;
                *puVar9 = 0;
              }
              sVar8 = sVar8 + 1;
              sVar11 = OPENSSL_sk_num(pOVar12);
            } while (sVar8 < sVar11);
          }
          OPENSSL_sk_sort((OPENSSL_STACK *)pXVar18->nodes,sk_X509_POLICY_NODE_call_cmp_func);
          pOVar6 = local_90;
        }
        OPENSSL_sk_pop_free_ex(pOVar12,sk_POLICY_MAPPING_call_free_func,POLICY_MAPPING_free);
        OPENSSL_sk_pop_free_ex(pOVar6,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
        pOVar6 = local_88;
        if (pXVar18 == (X509_POLICY_LEVEL *)0x0) {
          pXVar7 = (X509_POLICY_LEVEL *)0x0;
          goto LAB_00216ae9;
        }
        if (((ulong)local_78 & 0x20) == 0) goto LAB_00216987;
      }
      a_00 = (POLICY_CONSTRAINTS *)X509_get_ext_d2i(x,0x191,&local_9c,(int *)0x0);
      pXVar7 = pXVar18;
      if ((a_00 == (POLICY_CONSTRAINTS *)0x0) && (local_9c != -1)) goto LAB_00216ae9;
      if (a_00 != (POLICY_CONSTRAINTS *)0x0) {
        if (((ASN1_INTEGER *)a_00->requireExplicitPolicy == (ASN1_INTEGER *)0x0) &&
           (a_00->inhibitPolicyMapping == (ASN1_INTEGER *)0x0)) {
          ERR_put_error(0xb,0,0x90,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                        ,0x22f);
        }
        else {
          iVar3 = apply_skip_certs((ASN1_INTEGER *)a_00->requireExplicitPolicy,(size_t *)&local_70);
          if (iVar3 != 0) {
            iVar3 = apply_skip_certs((ASN1_INTEGER *)a_00->inhibitPolicyMapping,(size_t *)&local_60)
            ;
            POLICY_CONSTRAINTS_free(a_00);
            if (iVar3 == 0) goto LAB_00216ae9;
            goto LAB_00216a2f;
          }
        }
        POLICY_CONSTRAINTS_free(a_00);
        goto LAB_00216ae9;
      }
LAB_00216a2f:
      skip_certs = (ASN1_INTEGER *)X509_get_ext_d2i(x,0x2ec,&local_9c,(int *)0x0);
      if ((skip_certs == (ASN1_INTEGER *)0x0) && (local_9c != -1)) goto LAB_00216ae9;
      iVar3 = apply_skip_certs(skip_certs,(size_t *)&local_58);
      ASN1_INTEGER_free((ASN1_INTEGER *)skip_certs);
      if (iVar3 == 0) goto LAB_00216ae9;
      pOVar12 = local_80;
    } while (local_80 < local_38);
    if (local_70 == (undefined1 *)0x0) {
      if (local_50 == (OPENSSL_STACK *)0x0) {
        local_a8 = (OPENSSL_STACK *)0x0;
      }
      else {
        local_a8 = OPENSSL_sk_dup(local_50);
        if (local_a8 == (OPENSSL_STACK *)0x0) {
LAB_00216afb:
          local_a8 = (OPENSSL_STACK *)0x0;
          goto LAB_00216afd;
        }
        OPENSSL_sk_set_cmp_func(local_a8,asn1_object_cmp);
        OPENSSL_sk_sort(local_a8,sk_ASN1_OBJECT_call_cmp_func);
        iVar3 = OPENSSL_sk_is_sorted(local_a8);
        if (iVar3 == 0) {
          __assert_fail("user_policies == NULL || sk_ASN1_OBJECT_is_sorted(user_policies)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                        ,0x24d,
                        "int has_explicit_policy(struct stack_st_X509_POLICY_LEVEL *, const struct stack_st_ASN1_OBJECT *)"
                       );
        }
      }
      local_68 = (OPENSSL_STACK *)OPENSSL_sk_num(pOVar6);
      pOVar5 = (OPENSSL_STACK *)((long)&local_68[-1].comp + 7);
      puVar9 = (undefined8 *)OPENSSL_sk_value(pOVar6,(size_t)pOVar5);
      if ((*(int *)(puVar9 + 1) != 0) ||
         (sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar9), sVar8 != 0)) {
        local_80 = pOVar5;
        sVar8 = OPENSSL_sk_num(local_a8);
        sVar11 = OPENSSL_sk_num(local_a8);
        if (sVar11 != 0) {
          local_98 = 0;
          sVar11 = 0;
          do {
            pAVar15 = (ASN1_OBJECT *)OPENSSL_sk_value(local_a8,sVar11);
            iVar3 = OBJ_obj2nid(pAVar15);
            if (iVar3 == 0x2ea) goto LAB_00216afd;
            sVar11 = sVar11 + 1;
            sVar16 = OPENSSL_sk_num(local_a8);
          } while (sVar11 < sVar16);
        }
        if ((sVar8 == 0) || (*(int *)(puVar9 + 1) != 0)) {
          local_98 = 0;
          goto LAB_00216afd;
        }
        sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar9);
        if (sVar8 != 0) {
          sVar8 = 0;
          do {
            pvVar17 = OPENSSL_sk_value((OPENSSL_STACK *)*puVar9,sVar8);
            *(undefined4 *)((long)pvVar17 + 0x14) = 1;
            sVar8 = sVar8 + 1;
            sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar9);
          } while (sVar8 < sVar11);
        }
        if (local_68 != (OPENSSL_STACK *)0x0) {
          local_98 = 0x2b;
          pOVar5 = local_80;
          do {
            puVar9 = (undefined8 *)OPENSSL_sk_value(pOVar6,(size_t)pOVar5);
            sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar9);
            if (sVar8 == 0) {
              pOVar5 = (OPENSSL_STACK *)((long)&pOVar5[-1].comp + 7);
            }
            else {
              local_78 = (OPENSSL_STACK *)((long)&pOVar5[-1].comp + 7);
              sVar8 = 0;
              local_80 = pOVar5;
              do {
                puVar10 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)*puVar9,sVar8);
                if (*(int *)((long)puVar10 + 0x14) != 0) {
                  sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)puVar10[1]);
                  if (sVar11 == 0) {
                    iVar3 = OPENSSL_sk_find(local_a8,(size_t *)0x0,(void *)*puVar10,
                                            sk_ASN1_OBJECT_call_cmp_func);
                    if (iVar3 != 0) {
                      local_98 = 0;
                      pOVar6 = local_88;
                      goto LAB_00216afd;
                    }
                  }
                  else if (local_80 != (OPENSSL_STACK *)0x0) {
                    pXVar7 = (X509_POLICY_LEVEL *)OPENSSL_sk_value(local_88,(size_t)local_78);
                    sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)puVar10[1]);
                    if (sVar11 != 0) {
                      sVar11 = 0;
                      do {
                        policy = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)puVar10[1],sVar11)
                        ;
                        pXVar13 = x509_policy_level_find(pXVar7,policy);
                        if (pXVar13 != (X509_POLICY_NODE *)0x0) {
                          pXVar13->reachable = 1;
                        }
                        sVar11 = sVar11 + 1;
                        sVar16 = OPENSSL_sk_num((OPENSSL_STACK *)puVar10[1]);
                      } while (sVar11 < sVar16);
                    }
                  }
                }
                sVar8 = sVar8 + 1;
                sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar9);
                pOVar5 = local_78;
              } while (sVar8 < sVar11);
            }
            pOVar6 = local_88;
          } while (pOVar5 < local_68);
          goto LAB_00216afd;
        }
      }
      local_98 = 0x2b;
    }
    else {
      local_a8 = (OPENSSL_STACK *)0x0;
      local_98 = 0;
    }
  }
LAB_00216afd:
  x509_policy_level_free(pXVar18);
  OPENSSL_sk_free(local_a8);
  OPENSSL_sk_pop_free_ex(pOVar6,sk_X509_POLICY_LEVEL_call_free_func,x509_policy_level_free);
  return (int)local_98;
}

Assistant:

int X509_policy_check(const STACK_OF(X509) *certs,
                      const STACK_OF(ASN1_OBJECT) *user_policies,
                      unsigned long flags, X509 **out_current_cert) {
  *out_current_cert = NULL;
  int ret = X509_V_ERR_OUT_OF_MEM;
  X509_POLICY_LEVEL *level = NULL;
  STACK_OF(X509_POLICY_LEVEL) *levels = NULL;
  STACK_OF(ASN1_OBJECT) *user_policies_sorted = NULL;
  size_t num_certs = sk_X509_num(certs);

  // Skip policy checking if the chain is just the trust anchor.
  if (num_certs <= 1) {
    return X509_V_OK;
  }

  // See RFC 5280, section 6.1.2, steps (d) through (f).
  size_t explicit_policy =
      (flags & X509_V_FLAG_EXPLICIT_POLICY) ? 0 : num_certs + 1;
  size_t inhibit_any_policy =
      (flags & X509_V_FLAG_INHIBIT_ANY) ? 0 : num_certs + 1;
  size_t policy_mapping = (flags & X509_V_FLAG_INHIBIT_MAP) ? 0 : num_certs + 1;

  levels = sk_X509_POLICY_LEVEL_new_null();
  if (levels == NULL) {
    goto err;
  }

  for (size_t i = num_certs - 2; i < num_certs; i--) {
    X509 *cert = sk_X509_value(certs, i);
    if (!x509v3_cache_extensions(cert)) {
      goto err;
    }
    const int is_self_issued = (cert->ex_flags & EXFLAG_SI) != 0;

    if (level == NULL) {
      assert(i == num_certs - 2);
      level = x509_policy_level_new();
      if (level == NULL) {
        goto err;
      }
      level->has_any_policy = 1;
    }

    // RFC 5280, section 6.1.3, steps (d) and (e). |any_policy_allowed| is
    // computed as in step (d.2).
    const int any_policy_allowed =
        inhibit_any_policy > 0 || (i > 0 && is_self_issued);
    if (!process_certificate_policies(cert, level, any_policy_allowed)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }

    // RFC 5280, section 6.1.3, step (f).
    if (explicit_policy == 0 && x509_policy_level_is_empty(level)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }

    // Insert into the list.
    if (!sk_X509_POLICY_LEVEL_push(levels, level)) {
      goto err;
    }
    X509_POLICY_LEVEL *current_level = level;
    level = NULL;

    // If this is not the leaf certificate, we go to section 6.1.4. If it
    // is the leaf certificate, we go to section 6.1.5 instead.
    if (i != 0) {
      // RFC 5280, section 6.1.4, steps (a) and (b).
      level = process_policy_mappings(cert, current_level, policy_mapping > 0);
      if (level == NULL) {
        ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
        *out_current_cert = cert;
        goto err;
      }
    }

    // RFC 5280, section 6.1.4, step (h-j) for non-leaves, and section 6.1.5,
    // step (a-b) for leaves. In the leaf case, RFC 5280 says only to update
    // |explicit_policy|, but |policy_mapping| and |inhibit_any_policy| are no
    // longer read at this point, so we use the same process.
    if (i == 0 || !is_self_issued) {
      if (explicit_policy > 0) {
        explicit_policy--;
      }
      if (policy_mapping > 0) {
        policy_mapping--;
      }
      if (inhibit_any_policy > 0) {
        inhibit_any_policy--;
      }
    }
    if (!process_policy_constraints(cert, &explicit_policy, &policy_mapping,
                                    &inhibit_any_policy)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }
  }

  // RFC 5280, section 6.1.5, step (g). We do not output the policy set, so it
  // is only necessary to check if the user-constrained-policy-set is not empty.
  if (explicit_policy == 0) {
    // Build a sorted copy of |user_policies| for more efficient lookup.
    if (user_policies != NULL) {
      user_policies_sorted = sk_ASN1_OBJECT_dup(user_policies);
      if (user_policies_sorted == NULL) {
        goto err;
      }
      sk_ASN1_OBJECT_set_cmp_func(user_policies_sorted, asn1_object_cmp);
      sk_ASN1_OBJECT_sort(user_policies_sorted);
    }

    if (!has_explicit_policy(levels, user_policies_sorted)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }
  }

  ret = X509_V_OK;

err:
  x509_policy_level_free(level);
  // |user_policies_sorted|'s contents are owned by |user_policies|, so we do
  // not use |sk_ASN1_OBJECT_pop_free|.
  sk_ASN1_OBJECT_free(user_policies_sorted);
  sk_X509_POLICY_LEVEL_pop_free(levels, x509_policy_level_free);
  return ret;
}